

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * cmd_ln_parse_file_r(ps_config_t *inout_cmdln,ps_arg_t *defn,char *filename,int32 strict)

{
  ps_config_t *ppVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char **argv;
  long lVar5;
  cmd_ln_t *pcVar6;
  char **ppcVar7;
  ulong uVar8;
  int iVar9;
  uint argc;
  bool bVar10;
  char separator [5];
  char *local_78;
  undefined4 local_64;
  undefined1 local_60;
  int local_5c;
  ulong local_58;
  long local_50;
  int32 local_44;
  ps_arg_t *local_40;
  ps_config_t *local_38;
  
  local_60 = 0;
  local_64 = 0xa0d0920;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1b2,"Cannot open configuration file %s for reading\n",filename);
    return (cmd_ln_t *)0x0;
  }
  iVar2 = fgetc(__stream);
  if (iVar2 != -1) {
    do {
      pcVar4 = strchr((char *)&local_64,iVar2);
      if (pcVar4 == (char *)0x0) {
        local_44 = strict;
        local_40 = defn;
        local_38 = inout_cmdln;
        argv = (char **)__ckd_calloc__(0x1e,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                       ,0x1c4);
        local_78 = (char *)__ckd_calloc__(0x201,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                          ,0x1c6);
        local_58 = 0x200;
        local_5c = 0x1e;
        argc = 0;
        iVar9 = 0;
        goto LAB_0010b893;
      }
      iVar2 = fgetc(__stream);
    } while (iVar2 != -1);
  }
  fclose(__stream);
  return (cmd_ln_t *)0x0;
LAB_0010b893:
  local_50 = 0;
  do {
    if ((int)local_50 == 0 && (argc & 1) == 0) {
LAB_0010b8b5:
      if (iVar2 == 0x23) {
        do {
          iVar2 = fgetc(__stream);
          if (iVar2 == 10) break;
        } while (iVar2 != -1);
        iVar3 = fgetc(__stream);
        iVar2 = -1;
        if (iVar3 != -1) {
          do {
            pcVar4 = strchr((char *)&local_64,iVar3);
            iVar2 = iVar3;
            if (pcVar4 == (char *)0x0) goto LAB_0010b8b5;
            iVar3 = fgetc(__stream);
          } while (iVar3 != -1);
          iVar2 = -1;
        }
        goto LAB_0010b8b5;
      }
      iVar3 = (int)local_58;
      if (iVar2 == -1) {
        bVar10 = true;
        goto LAB_0010bac0;
      }
    }
    else {
      iVar3 = (int)local_58;
    }
    if ((iVar2 == 0x22) || (iVar2 == 0x27)) {
      if (iVar9 == iVar2) {
        iVar9 = 0;
      }
      else {
        bVar10 = iVar9 != 0;
        iVar9 = iVar2;
        if (bVar10) {
          bVar10 = false;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x1dd,"Nesting quotations is not supported!\n");
          goto LAB_0010bac0;
        }
      }
    }
    else {
      if (iVar2 == -1) break;
      if (iVar9 == 0) {
        pcVar4 = strchr((char *)&local_64,iVar2);
        iVar3 = (int)local_58;
        if (pcVar4 != (char *)0x0) break;
      }
      if (iVar3 <= (int)local_50) {
        pcVar4 = (char *)__ckd_realloc__(local_78,(long)(iVar3 * 2 + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                         ,0x207);
        if (pcVar4 == (char *)0x0) {
          bVar10 = false;
          goto LAB_0010bac0;
        }
        local_58 = (ulong)(uint)(iVar3 * 2);
        local_78 = pcVar4;
      }
      lVar5 = (long)(int)local_50;
      local_50 = lVar5 + 1;
      local_78[lVar5] = (char)iVar2;
      local_78[lVar5 + 1] = '\0';
    }
    iVar2 = fgetc(__stream);
  } while( true );
  ppcVar7 = argv;
  iVar3 = local_5c;
  if (local_5c <= (int)argc) {
    iVar3 = local_5c * 2;
    ppcVar7 = (char **)__ckd_realloc__(argv,(long)iVar3 << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                       ,0x1e9);
    if (ppcVar7 == (char **)0x0) {
      bVar10 = false;
LAB_0010bac0:
      fclose(__stream);
      ckd_free(local_78);
      ppVar1 = local_38;
      if (bVar10) {
        pcVar6 = cmd_ln_parse_r(local_38,local_40,argc,argv,local_44);
        if (pcVar6 != (cmd_ln_t *)0x0) {
          if (pcVar6 == ppVar1) {
            ppcVar7 = (char **)__ckd_realloc__(pcVar6->f_argv,(ulong)(pcVar6->f_argc + argc) << 3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                               ,0x119);
            pcVar6->f_argv = ppcVar7;
            memcpy(ppcVar7 + pcVar6->f_argc,argv,(long)(int)argc << 3);
            ckd_free(argv);
            pcVar6->f_argc = pcVar6->f_argc + argc;
            return pcVar6;
          }
          pcVar6->f_argc = argc;
          pcVar6->f_argv = argv;
          return pcVar6;
        }
        if (0 < (int)argc) {
          uVar8 = 0;
          do {
            ckd_free(argv[uVar8]);
            uVar8 = uVar8 + 1;
          } while (argc != uVar8);
        }
      }
      else if (0 < (int)argc) {
        uVar8 = 0;
        do {
          ckd_free(argv[uVar8]);
          uVar8 = uVar8 + 1;
        } while (argc != uVar8);
      }
      ckd_free(argv);
      return (cmd_ln_t *)0x0;
    }
  }
  local_5c = iVar3;
  pcVar4 = __ckd_salloc__(local_78,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x1f2);
  ppcVar7[argc] = pcVar4;
  *local_78 = '\0';
  if (iVar9 != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1f8,"Unclosed quotation, having EOF close it...\n");
  }
  argc = argc + 1;
  bVar10 = true;
  while( true ) {
    argv = ppcVar7;
    if (iVar2 == -1) goto LAB_0010bac0;
    pcVar4 = strchr((char *)&local_64,iVar2);
    if (pcVar4 == (char *)0x0) break;
    iVar2 = fgetc(__stream);
  }
  goto LAB_0010b893;
}

Assistant:

ps_config_t *
cmd_ln_parse_file_r(ps_config_t *inout_cmdln, const ps_arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}